

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

string * __thiscall rcg::Device::getAccessStatus_abi_cxx11_(Device *this)

{
  PIFGetDeviceInfo p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  void *pvVar4;
  char *pcVar5;
  long in_RSI;
  string *in_RDI;
  GC_ERROR err;
  size_t size;
  int32_t status;
  INFO_DATATYPE type;
  lock_guard<std::mutex> lock;
  string *ret;
  Device *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_34;
  size_t local_30;
  undefined4 local_24;
  INFO_DATATYPE local_20;
  undefined1 local_19;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,(mutex_type *)in_stack_ffffffffffffff58);
  local_19 = 0;
  std::__cxx11::string::string(in_RDI);
  local_20 = 0;
  local_24 = 0xffffffff;
  local_30 = 4;
  local_34 = -0x3e9;
  if (*(long *)(in_RSI + 0x80) == 0) {
    peVar3 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11a3ab);
    pvVar4 = Interface::getHandle(peVar3);
    if (pvVar4 != (void *)0x0) {
      peVar2 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11a3d7);
      p_Var1 = peVar2->IFGetDeviceInfo;
      getParent(in_stack_ffffffffffffff58);
      peVar3 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11a401);
      pvVar4 = Interface::getHandle(peVar3);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_34 = (*p_Var1)(pvVar4,pcVar5,5,&local_20,&local_24,&local_30);
      std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x11a45f);
    }
  }
  else {
    peVar2 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11a348);
    local_34 = (*peVar2->DevGetInfo)(*(DEV_HANDLE *)(in_RSI + 0x80),5,&local_20,&local_24,&local_30)
    ;
  }
  if ((local_34 == 0) && (local_20 == 5)) {
    switch(local_24) {
    case 1:
      std::__cxx11::string::operator=(in_RDI,"ReadWrite");
      break;
    case 2:
      std::__cxx11::string::operator=(in_RDI,"ReadOnly");
      break;
    case 3:
      std::__cxx11::string::operator=(in_RDI,"NoAccess");
      break;
    case 4:
      std::__cxx11::string::operator=(in_RDI,"Busy");
      break;
    case 5:
      std::__cxx11::string::operator=(in_RDI,"OpenReadWrite");
      break;
    case 6:
      std::__cxx11::string::operator=(in_RDI,"OpenReadWrite");
      break;
    default:
      std::__cxx11::string::operator=(in_RDI,"Unknown");
    }
  }
  local_19 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11a585);
  return in_RDI;
}

Assistant:

std::string Device::getAccessStatus()
{
  std::lock_guard<std::mutex> lock(mtx);
  std::string ret;

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  int32_t status=-1;
  size_t size=sizeof(status);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (dev != 0)
  {
    err=gentl->DevGetInfo(dev, GenTL::DEVICE_INFO_ACCESS_STATUS, &type, &status, &size);
  }
  else if (parent->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(getParent()->getHandle(), id.c_str(),
                               GenTL::DEVICE_INFO_ACCESS_STATUS, &type, &status, &size);
  }

  if (err == GenTL::GC_ERR_SUCCESS)
  {
    if (type == GenTL::INFO_DATATYPE_INT32)
    {
      switch (status)
      {
        case GenTL::DEVICE_ACCESS_STATUS_READWRITE:
          ret="ReadWrite";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_READONLY:
          ret="ReadOnly";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_NOACCESS:
          ret="NoAccess";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_BUSY:
          ret="Busy";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_OPEN_READWRITE:
          ret="OpenReadWrite";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_OPEN_READONLY:
          ret="OpenReadWrite";
          break;

        default:
          ret="Unknown";
          break;
      }
    }
  }

  return ret;
}